

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string * __thiscall
google::protobuf::Reflection::GetRepeatedString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field,
          int index)

{
  bool bVar1;
  CppStringType CVar2;
  uint32_t uVar3;
  Cord *this_00;
  string *psVar4;
  char *description;
  Descriptor *pDVar5;
  Metadata MVar6;
  
  MVar6 = Message::GetMetadata(message);
  if (MVar6.reflection != this) {
    pDVar5 = this->descriptor_;
    MVar6 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar5,MVar6.descriptor,field,"GetRepeatedString");
  }
  pDVar5 = this->descriptor_;
  if (field->containing_type_ == pDVar5) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"GetRepeatedString",CPPTYPE_STRING);
      }
      if ((field->field_0x1 & 8) == 0) {
        CVar2 = FieldDescriptor::cpp_string_type(field);
        if ((CVar2 != kView) && (CVar2 != kString)) {
          if (CVar2 == kCord) {
            this_00 = GetRepeatedField<absl::lts_20250127::Cord>(this,message,field,index);
            absl::lts_20250127::Cord::operator_cast_to_string(__return_storage_ptr__,this_00);
            return __return_storage_ptr__;
          }
          internal::Unreachable
                    ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0x877);
        }
        psVar4 = GetRepeatedPtrField<std::__cxx11::string>(this,message,field,index);
      }
      else {
        uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        psVar4 = internal::ExtensionSet::GetRepeatedString_abi_cxx11_
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                            field->number_,index);
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
      return __return_storage_ptr__;
    }
    pDVar5 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar5,field,"GetRepeatedString",description);
}

Assistant:

std::string Reflection::GetRepeatedString(const Message& message,
                                          const FieldDescriptor* field,
                                          int index) const {
  USAGE_CHECK_ALL(GetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        return std::string(GetRepeatedField<absl::Cord>(message, field, index));
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        return GetRepeatedPtrField<std::string>(message, field, index);
    }
    internal::Unreachable();
  }
}